

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::EnumNumMethod::~EnumNumMethod(EnumNumMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~EnumNumMethod((EnumNumMethod *)0x9378f8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

EnumNumMethod() : SystemSubroutine(KnownSystemName::Num, SubroutineKind::Function) {}